

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

_Bool container_iterator_next
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  long lVar8;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar9;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    uVar1 = *value;
    if (uVar1 == 0xffff) {
      return false;
    }
    lVar3 = *(long *)((long)c + 8);
    lVar8 = (long)it->index;
    uVar7 = (uint)*(ushort *)(lVar3 + 2 + lVar8 * 4) + (uint)*(ushort *)(lVar3 + lVar8 * 4);
    if (uVar7 < uVar1 || uVar7 == uVar1) {
      iVar5 = it->index + 1;
      it->index = iVar5;
      if (*c <= iVar5) {
        return false;
      }
      uVar7 = (uint)*(ushort *)(lVar3 + 4 + lVar8 * 4);
    }
    else {
      uVar7 = uVar1 + 1;
    }
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    iVar4 = iVar5 + 1;
    it->index = iVar4;
    if (*c <= iVar4) {
      return iVar4 < *c;
    }
    uVar7 = (uint)*(ushort *)(*(long *)((long)c + 8) + 2 + (long)iVar5 * 2);
  }
  else {
    iVar2 = it->index;
    iVar5 = iVar2 + 1;
    iVar4 = iVar2 + 0x40;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    it->index = iVar5;
    uVar7 = iVar4 >> 6;
    uVar9 = (ulong)uVar7;
    if (0x3ff < uVar7) {
      return false;
    }
    bVar6 = (char)iVar2 + 1;
    uVar10 = (*(ulong *)(*(long *)((long)c + 8) + (ulong)uVar7 * 8) >> (bVar6 & 0x3f)) <<
             (bVar6 & 0x3f);
    uVar11 = (ulong)uVar7;
    if (iVar2 - 0xffffU < 0xffffffc0 && uVar10 == 0) {
      do {
        uVar9 = uVar11 + 1;
        uVar10 = *(ulong *)(*(long *)((long)c + 8) + 8 + uVar11 * 8);
        if (uVar10 != 0) break;
        bVar12 = uVar11 < 0x3fe;
        uVar11 = uVar9;
      } while (bVar12);
    }
    if (uVar10 == 0) {
      return uVar10 != 0;
    }
    lVar3 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    uVar7 = (uint)lVar3 | (int)uVar9 << 6;
    it->index = uVar7;
  }
  *value = (uint16_t)uVar7;
  return true;
}

Assistant:

bool container_iterator_next(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index++;

            uint32_t wordindex = it->index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) {
                return false;
            }

            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            // next part could be optimized/simplified
            while (word == 0 &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index++;
            if (it->index < ac->cardinality) {
                *value = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == UINT16_MAX) {  // Avoid overflow to zero
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            uint32_t limit =
                rc->runs[it->index].value + rc->runs[it->index].length;
            if (*value < limit) {
                (*value)++;
                return true;
            }

            it->index++;
            if (it->index < rc->n_runs) {
                *value = rc->runs[it->index].value;
                return true;
            }
            return false;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}